

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void solveMatrixT(HighsInt X_Start,HighsInt x_end,HighsInt y_start,HighsInt y_end,HighsInt *t_index,
                 double *t_value,double t_pivot,HighsInt *rhs_count,HighsInt *rhs_index,
                 double *rhs_array)

{
  double dVar1;
  int iVar2;
  double local_58;
  double value1;
  double value0;
  HighsInt index;
  HighsInt k_1;
  HighsInt work_count;
  HighsInt k;
  double pivot_multiplier;
  double t_pivot_local;
  double *t_value_local;
  HighsInt *t_index_local;
  HighsInt y_end_local;
  HighsInt y_start_local;
  HighsInt x_end_local;
  HighsInt X_Start_local;
  
  pivot_multiplier = 0.0;
  for (k = X_Start; k < x_end; k = k + 1) {
    pivot_multiplier = t_value[k] * rhs_array[t_index[k]] + pivot_multiplier;
  }
  if (1e-14 < ABS(pivot_multiplier)) {
    work_count = *rhs_count;
    for (k_1 = y_start; k_1 < y_end; k_1 = k_1 + 1) {
      iVar2 = t_index[k_1];
      dVar1 = rhs_array[iVar2];
      local_58 = -(pivot_multiplier / t_pivot) * t_value[k_1] + dVar1;
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        rhs_index[work_count] = iVar2;
        work_count = work_count + 1;
      }
      if (ABS(local_58) < 1e-14) {
        local_58 = 1e-50;
      }
      rhs_array[iVar2] = local_58;
    }
    *rhs_count = work_count;
  }
  return;
}

Assistant:

static void solveMatrixT(const HighsInt X_Start, const HighsInt x_end,
                         const HighsInt y_start, const HighsInt y_end,
                         const HighsInt* t_index, const double* t_value,
                         const double t_pivot, HighsInt* rhs_count,
                         HighsInt* rhs_index, double* rhs_array) {
  // Collect by X
  double pivot_multiplier = 0;
  for (HighsInt k = X_Start; k < x_end; k++)
    pivot_multiplier += t_value[k] * rhs_array[t_index[k]];

  // Scatter by Y
  if (fabs(pivot_multiplier) > kHighsTiny) {
    HighsInt work_count = *rhs_count;

    pivot_multiplier /= t_pivot;
    for (HighsInt k = y_start; k < y_end; k++) {
      const HighsInt index = t_index[k];
      const double value0 = rhs_array[index];
      const double value1 = value0 - pivot_multiplier * t_value[k];
      if (value0 == 0) rhs_index[work_count++] = index;
      rhs_array[index] = (fabs(value1) < kHighsTiny) ? kHighsZero : value1;
    }

    *rhs_count = work_count;
  }
}